

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O1

shared_ptr<GenApi_3_4::CNodeMapRef> __thiscall
rcg::allocNodeMap(rcg *this,shared_ptr<const_rcg::GenTLWrapper> *gentl,void *port,CPort *cport,
                 char *xml)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  GC_ERROR GVar3;
  int iVar4;
  uint32_t uVar5;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *__p;
  size_t sVar6;
  int *piVar7;
  ulonglong uVar8;
  char *zipData;
  GenTLException *pGVar9;
  long *plVar10;
  long *plVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  ulong uVar13;
  element_type *__nptr;
  void *pvVar14;
  ulong uVar15;
  bool bVar16;
  shared_ptr<GenApi_3_4::CNodeMapRef> sVar17;
  string name_1;
  size_t length;
  shared_ptr<GenApi_3_4::CNodeMapRef> nodemap;
  INFO_DATATYPE type;
  uint32_t n;
  string url;
  string saddress;
  string slength;
  size_t size;
  gcstring portname;
  string name;
  char tmp [1024];
  string local_8b0;
  ulonglong local_890;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *local_888;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_880;
  rcg *local_878;
  void *local_870;
  uint32_t local_864;
  INFO_DATATYPE local_860;
  uint32_t local_85c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  element_type *local_838;
  long local_830;
  undefined1 local_828 [24];
  element_type *local_810;
  PGCReadPort local_808;
  undefined1 local_800 [16];
  CPort *local_7f0;
  PGCRegisterEvent local_7e8;
  undefined1 local_7e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7d8;
  undefined1 local_7d0 [232];
  ios_base local_6e8 [264];
  string local_5e0;
  string local_5c0 [4];
  ios_base local_540 [264];
  string local_438 [32];
  
  local_7f0 = cport;
  __p = (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)operator_new(0x68);
  GenICam_3_4::gcstring::gcstring((gcstring *)local_438,"Device");
  (((CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)&__p->super_CGeneric_XMLLoaderParams)->
  super_CGeneric_XMLLoaderParams)._vptr_CGeneric_XMLLoaderParams =
       (_func_int **)&PTR__Initialize_001457b8;
  __p->_Ptr = (INodeMap *)0x0;
  GenICam_3_4::gcstring::gcstring(&__p->_DeviceName,(gcstring *)local_438);
  __p->_pRefCount = (int *)0x0;
  (((CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)&__p->super_CGeneric_XMLLoaderParams)->
  super_CGeneric_XMLLoaderParams)._vptr_CGeneric_XMLLoaderParams =
       (_func_int **)&PTR__Initialize_001456e0;
  local_888 = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<GenApi_3_4::CNodeMapRef*>
            (&_Stack_880,(CNodeMapRef *)__p);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_438);
  local_85c = 0;
  GVar3 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->GCGetNumPortURLs)(port,&local_85c);
  if (GVar3 != 0) {
    pGVar9 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"allocNodeMap()","");
    GenTLException::GenTLException(pGVar9,local_438,gentl);
    __cxa_throw(pGVar9,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  if (local_85c == 0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    _Var12._M_pi = extraout_RDX;
    uVar5 = local_85c;
    goto LAB_00120829;
  }
  local_864 = local_85c;
  local_878 = this;
  memset(local_438,0,0x400);
  local_7e8 = (PGCRegisterEvent)0x400;
  GVar3 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->GCGetPortURLInfo)(port,0,0,&local_860,local_438,(size_t *)(local_800 + 0x18));
  if (GVar3 != 0) {
    pGVar9 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_7e0 = (undefined1  [8])local_7d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"allocNodeMap()","");
    GenTLException::GenTLException(pGVar9,(string *)local_7e0,gentl);
    __cxa_throw(pGVar9,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  sVar6 = strlen((char *)local_438);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_858,local_438,(long)&local_438[0]._M_dataplus._M_p + sVar6);
  local_870 = port;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e0);
  uVar13 = 6;
  if (local_858._M_string_length < 6) {
    uVar13 = local_858._M_string_length;
  }
  if (local_858._M_string_length != 0) {
    uVar15 = 0;
    do {
      iVar4 = tolower((int)local_858._M_dataplus._M_p[uVar15]);
      local_8b0._M_dataplus._M_p._0_1_ = (char)iVar4;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7e0,(char *)&local_8b0,1);
      uVar15 = uVar15 + 1;
    } while (uVar13 != uVar15);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e0);
  std::ios_base::~ios_base((ios_base *)(local_7d0 + 0x60));
  iVar4 = std::__cxx11::string::compare((char *)local_5c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._M_dataplus._M_p != &local_5c0[0].field_2) {
    operator_delete(local_5c0[0]._M_dataplus._M_p);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e0);
    uVar13 = 5;
    if (local_858._M_string_length < 5) {
      uVar13 = local_858._M_string_length;
    }
    if (local_858._M_string_length != 0) {
      uVar15 = 0;
      do {
        iVar4 = tolower((int)local_858._M_dataplus._M_p[uVar15]);
        local_8b0._M_dataplus._M_p._0_1_ = (char)iVar4;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7e0,(char *)&local_8b0,1);
        uVar15 = uVar15 + 1;
      } while (uVar13 != uVar15);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e0);
    std::ios_base::~ios_base((ios_base *)(local_7d0 + 0x60));
    iVar4 = std::__cxx11::string::compare((char *)local_5c0);
    this = local_878;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0[0]._M_dataplus._M_p != &local_5c0[0].field_2) {
      operator_delete(local_5c0[0]._M_dataplus._M_p);
    }
    if (iVar4 != 0) {
      pGVar9 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::operator+(local_5c0,"allocNodeMap(): Cannot interpret URL: ",&local_858);
      std::__cxx11::string::string
                ((string *)local_7e0,local_5c0[0]._M_dataplus._M_p,(allocator *)&local_8b0);
      GenTLException::GenTLException(pGVar9,(string *)local_7e0);
      __cxa_throw(pGVar9,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    std::__cxx11::string::compare((ulong)&local_858,5,(char *)0x3);
    std::__cxx11::string::substr((ulong)local_5c0,(ulong)&local_858);
    __nptr = (element_type *)local_5c0[0]._M_string_length;
    if (local_5c0[0]._M_string_length < (element_type *)0x5) {
LAB_001204b2:
      bVar16 = false;
    }
    else {
      anon_unknown_3::toLower
                (&local_8b0,local_5c0,
                 (size_t)((long)&((element_type *)(local_5c0[0]._M_string_length + -0x1d0))->lib + 4
                         ),4);
      iVar4 = std::__cxx11::string::compare((char *)&local_8b0);
      bVar16 = iVar4 == 0;
    }
    pvVar14 = local_870;
    if (((element_type *)0x4 < __nptr) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8b0._M_dataplus._M_p != &local_8b0.field_2)) {
      operator_delete(local_8b0._M_dataplus._M_p);
    }
    if (bVar16) {
      GenICam_3_4::gcstring::gcstring((gcstring *)local_7e0,local_5c0[0]._M_dataplus._M_p);
      GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromZIPFile
                (local_888,(gcstring *)local_7e0);
    }
    else {
      GenICam_3_4::gcstring::gcstring((gcstring *)local_7e0,local_5c0[0]._M_dataplus._M_p);
      GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromFile
                (local_888,(gcstring *)local_7e0);
    }
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_7e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0[0]._M_dataplus._M_p != &local_5c0[0].field_2) {
      operator_delete(local_5c0[0]._M_dataplus._M_p);
    }
LAB_00120799:
    local_7e8 = (PGCRegisterEvent)0x400;
    GVar3 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->GCGetPortInfo)(pvVar14,0xc,&local_860,local_438,(size_t *)(local_800 + 0x18))
    ;
    if (GVar3 != 0) {
      pGVar9 = (GenTLException *)__cxa_allocate_exception(0x28);
      local_7e0 = (undefined1  [8])local_7d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"allocNodeMap()","");
      GenTLException::GenTLException(pGVar9,(string *)local_7e0,gentl);
      __cxa_throw(pGVar9,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    GenICam_3_4::gcstring::gcstring((gcstring *)local_7e0,(char *)local_438);
    iVar4 = (*(((CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)
               &local_888->super_CGeneric_XMLLoaderParams)->super_CGeneric_XMLLoaderParams).
              _vptr_CGeneric_XMLLoaderParams[0xc])(local_888,local_7f0,local_7e0);
    if ((char)iVar4 == '\0') {
      pGVar9 = (GenTLException *)__cxa_allocate_exception(0x28);
      local_810 = (element_type *)local_800;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_810,"allocNodeMap(): Cannot connect port: ","");
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_810);
      local_838 = (element_type *)*plVar10;
      plVar11 = plVar10 + 2;
      if (local_838 == (element_type *)plVar11) {
        local_828._0_8_ = *plVar11;
        local_828._8_8_ = plVar10[3];
        local_838 = (element_type *)local_828;
      }
      else {
        local_828._0_8_ = *plVar11;
      }
      local_830 = plVar10[1];
      *plVar10 = (long)plVar11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::string((string *)local_5c0,(char *)local_838,(allocator *)&local_890);
      GenTLException::GenTLException(pGVar9,local_5c0);
      __cxa_throw(pGVar9,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_7e0);
    _Var12._M_pi = extraout_RDX_00;
    uVar5 = local_864;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858._M_dataplus._M_p != &local_858.field_2) {
      operator_delete(local_858._M_dataplus._M_p);
      _Var12._M_pi = extraout_RDX_01;
      uVar5 = local_864;
    }
LAB_00120829:
    _Var1._M_pi = _Stack_880._M_pi;
    if (uVar5 != 0) {
      *(undefined8 *)(this + 8) = 0;
      _Stack_880._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> **)this = local_888;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
      local_888 = (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)0x0;
    }
    if (_Stack_880._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_880._M_pi);
      _Var12._M_pi = extraout_RDX_02;
    }
    sVar17.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var12._M_pi;
    sVar17.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<GenApi_3_4::CNodeMapRef>)
           sVar17.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__cxx11::string::compare((ulong)&local_858,6,(char *)0x3);
  std::__cxx11::string::substr((ulong)local_7e0,(ulong)&local_858);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_5c0,(string *)local_7e0,_S_out|_S_in);
  if (local_7e0 != (undefined1  [8])local_7d0) {
    operator_delete((void *)local_7e0);
  }
  local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
  local_8b0._M_string_length = 0;
  local_8b0.field_2._M_local_buf[0] = '\0';
  local_838 = (element_type *)local_828;
  local_830 = 0;
  local_828._0_8_ = local_828._0_8_ & 0xffffffffffffff00;
  local_810 = (element_type *)local_800;
  local_808 = (PGCReadPort)0x0;
  local_800[0] = (_func_GC_ERROR)0x0;
  local_828._16_8_ = gentl;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_5c0,(string *)&local_8b0,';');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_5c0,(string *)&local_838,';');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_5c0,(string *)&local_810,';');
  __nptr = local_838;
  piVar7 = __errno_location();
  iVar4 = *piVar7;
  *piVar7 = 0;
  gentl = (shared_ptr<const_rcg::GenTLWrapper> *)local_7e0;
  this = (rcg *)strtoull((char *)__nptr,(char **)gentl,0x10);
  peVar2 = local_810;
  if (local_7e0 == (undefined1  [8])__nptr) {
    std::__throw_invalid_argument("stoull");
  }
  else {
    if (*piVar7 == 0) {
      *piVar7 = iVar4;
    }
    else if (*piVar7 == 0x22) {
      std::__throw_out_of_range("stoull");
      goto LAB_001204b2;
    }
    iVar4 = *piVar7;
    *piVar7 = 0;
    uVar8 = strtoull((char *)local_810,(char **)local_7e0,0x10);
    gentl = (shared_ptr<const_rcg::GenTLWrapper> *)local_828._16_8_;
    pvVar14 = local_870;
    if (local_7e0 != (undefined1  [8])peVar2) {
      if (*piVar7 == 0) {
LAB_001205ba:
        *piVar7 = iVar4;
      }
      else if (*piVar7 == 0x22) {
        xml = (char *)&local_8b0.field_2;
        uVar8 = std::__throw_out_of_range("stoull");
        goto LAB_001205ba;
      }
      local_890 = uVar8;
      zipData = (char *)operator_new__(uVar8 + 1);
      GVar3 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->GCReadPort)(pvVar14,(uint64_t)this,zipData,&local_890);
      if (GVar3 != 0) goto LAB_00120aac;
      zipData[local_890] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)xml != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        if (*xml == '\0') {
          xml = local_8b0._M_dataplus._M_p;
        }
        std::ofstream::ofstream(local_7e0,xml,_S_bin);
        (*(code *)local_7d8._M_pi[6]._vptr__Sp_counted_base)
                  ((filebuf *)&local_7d8,zipData,local_890);
        local_7e0 = (undefined1  [8])_VTT;
        *(undefined8 *)(local_7e0 + (long)_VTT[-1].DSGetNumBufferParts) = _png_destroy_write_struct;
        std::filebuf::~filebuf((filebuf *)&local_7d8);
        std::ios_base::~ios_base(local_6e8);
      }
      this = local_878;
      if (local_8b0._M_string_length < 5) {
        bVar16 = false;
        pvVar14 = local_870;
      }
      else {
        anon_unknown_3::toLower(&local_5e0,&local_8b0,local_8b0._M_string_length - 4,4);
        iVar4 = std::__cxx11::string::compare((char *)&local_5e0);
        pvVar14 = local_870;
        bVar16 = iVar4 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
          operator_delete(local_5e0._M_dataplus._M_p);
        }
      }
      if (bVar16) {
        GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromZIPData
                  (local_888,zipData,local_890);
      }
      else {
        GenICam_3_4::gcstring::gcstring((gcstring *)local_7e0,zipData);
        GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromString
                  (local_888,(gcstring *)local_7e0);
        GenICam_3_4::gcstring::~gcstring((gcstring *)local_7e0);
      }
      operator_delete__(zipData);
      if (local_810 != (element_type *)local_800) {
        operator_delete(local_810);
      }
      if (local_838 != (element_type *)local_828) {
        operator_delete(local_838);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
        operator_delete(local_8b0._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_5c0);
      std::ios_base::~ios_base(local_540);
      goto LAB_00120799;
    }
  }
  std::__throw_invalid_argument("stoull");
LAB_00120aac:
  pGVar9 = (GenTLException *)__cxa_allocate_exception(0x28);
  local_7e0 = (undefined1  [8])local_7d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"allocNodeMap()","");
  GenTLException::GenTLException
            (pGVar9,(string *)local_7e0,(shared_ptr<const_rcg::GenTLWrapper> *)local_828._16_8_);
  __cxa_throw(pGVar9,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

std::shared_ptr<GenApi::CNodeMapRef> allocNodeMap(std::shared_ptr<const GenTLWrapper> gentl,
                                                  void *port, CPort *cport, const char *xml)
{
  std::shared_ptr<GenApi::CNodeMapRef> nodemap(new GenApi::CNodeMapRef());

  try
  {
    // get number of URLS that the given port provides

    uint32_t n=0;
    if (gentl->GCGetNumPortURLs(port, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    if (n == 0)
    {
      return std::shared_ptr<GenApi::CNodeMapRef>();
    }

    // get the first URL

    GenTL::INFO_DATATYPE type;
    char tmp[1024]="";
    size_t size=sizeof(tmp);

    if (gentl->GCGetPortURLInfo(port, 0, GenTL::URL_INFO_URL, &type, tmp, &size) !=
        GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    // interpret the URL and load XML File

    std::string url=tmp;
    if (toLower(url, 0, 6) == "local:")
    {
      // interpret local URL

      size_t i=6;
      if (url.compare(i, 3, "///") == 0)
      {
        i+=3;
      }

      std::stringstream in(url.substr(i));
      std::string name, saddress, slength;

      std::getline(in, name, ';');
      std::getline(in, saddress, ';');
      std::getline(in, slength, ';');

      uint64_t address=std::stoull(saddress, 0, 16);
      size_t length=static_cast<size_t>(std::stoull(slength, 0, 16));

      // read XML or ZIP from registers

      std::unique_ptr<char[]> buffer(new char[length+1]);

      if (gentl->GCReadPort(port, address, buffer.get(), &length) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("allocNodeMap()", gentl);
      }

      buffer.get()[length]='\0';

      // store XML file

      if (xml != 0)
      {
        if (xml[0] == '\0')
        {
          xml=name.c_str();
        }

        std::ofstream out(xml, std::ios::binary);

        out.rdbuf()->sputn(buffer.get(), static_cast<std::streamsize>(length));
      }

      // load XML or ZIP from registers

      if (name.size() > 4 && toLower(name, name.size()-4, 4) == ".zip")
      {
        nodemap->_LoadXMLFromZIPData(buffer.get(), length);
      }
      else
      {
        GENICAM_NAMESPACE::gcstring sxml=buffer.get();
        nodemap->_LoadXMLFromString(sxml);
      }
    }
    else if (toLower(url, 0, 5) == "file:")
    {
      // interpret local URL

      size_t i=5;
      if (url.compare(i, 3, "///") == 0)
      {
        i+=3;
      }

      std::string name=url.substr(i);

      // load XML or ZIP from file

      if (name.size() > 4 && toLower(name, name.size()-4, 4) == ".zip")
      {
        GENICAM_NAMESPACE::gcstring file=name.c_str();
        nodemap->_LoadXMLFromZIPFile(file);
      }
      else
      {
        GENICAM_NAMESPACE::gcstring file=name.c_str();
        nodemap->_LoadXMLFromFile(file);
      }
    }
    else
    {
      throw GenTLException(("allocNodeMap(): Cannot interpret URL: "+url).c_str());
    }

    // get port name

    size=sizeof(tmp);

    if (gentl->GCGetPortInfo(port, GenTL::PORT_INFO_PORTNAME, &type, tmp, &size) !=
        GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    GENICAM_NAMESPACE::gcstring portname=tmp;
    if (!nodemap->_Connect(cport, portname))
    {
      throw GenTLException((std::string("allocNodeMap(): Cannot connect port: ")+tmp).c_str());
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    throw GenTLException(ex.what());
  }

  return nodemap;
}